

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::UninterpretedOption_NamePart::_InternalSerialize
          (UninterpretedOption_NamePart *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  uint8_t *puVar5;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    puVar4 = (undefined8 *)((ulong)(this->name_part_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,*(int *)(puVar4 + 1),SERIALIZE,
               "google.protobuf.UninterpretedOption.NamePart.name_part");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->name_part_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  if ((uVar2 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->is_extension_;
    *target = '\x10';
    target[1] = bVar1;
    target = target + 2;
  }
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffc) + 8),target,stream);
  return puVar5;
}

Assistant:

uint8_t* UninterpretedOption_NamePart::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption.NamePart)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string name_part = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name_part().data(), static_cast<int>(this->_internal_name_part().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.NamePart.name_part");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name_part(), target);
  }

  // required bool is_extension = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_is_extension(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption.NamePart)
  return target;
}